

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool updateAndroidManifest(Options *options)

{
  qsizetype qVar1;
  ulong uVar2;
  Data *pDVar3;
  FILE *pFVar4;
  char cVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  QString *pQVar9;
  iterator iVar10;
  iterator iVar11;
  char16_t *pcVar12;
  QString *feature;
  char *__ptr;
  long lVar13;
  char16_t *pcVar14;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QAnyStringView qualifiedName;
  QAnyStringView qualifiedName_00;
  QAnyStringView QVar15;
  QAnyStringView QVar16;
  QAnyStringView QVar17;
  QAnyStringView QVar18;
  QAnyStringView QVar19;
  QLatin1String QVar20;
  QAnyStringView QVar21;
  QAnyStringView QVar22;
  QAnyStringView QVar23;
  QAnyStringView QVar24;
  undefined1 auVar25 [16];
  QStringView QVar26;
  size_t sStack_1b0;
  QLatin1StringView local_180;
  QStringView local_170;
  QLatin1StringView local_160;
  QStringView local_150;
  QLatin1StringView local_140;
  QXmlStreamReader reader_1;
  QXmlStreamReader reader;
  QMap<QString,_QString> local_110;
  QArrayDataPointer<char16_t> local_108;
  undefined8 local_e8;
  undefined8 uStack_e0;
  QArrayDataPointer<char16_t> local_d8;
  QHash<QString,_QString> local_c0;
  QArrayDataPointer<char16_t> local_b8;
  undefined1 local_98 [8];
  char16_t *pcStack_90;
  qsizetype local_88;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (options->verbose == true) {
    fwrite("  -- AndroidManifest.xml \n",0x1a,1,_stdout);
  }
  local_c0.d = (Data *)0x0;
  local_b8.d = (Data *)0x0;
  local_d8.d = (Data *)0x0;
  local_d8.ptr = (char16_t *)0x0;
  local_b8.ptr = L"-- %%INSERT_APP_NAME%% --";
  local_d8.size = 0;
  local_b8.size = 0x19;
  pQVar9 = QHash<QString,_QString>::operator[](&local_c0,(QString *)&local_b8);
  QString::operator=(pQVar9,(QString *)&options->appName);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
  local_b8.d = (Data *)0x0;
  local_d8.d = (Data *)0x0;
  local_d8.ptr = (char16_t *)0x0;
  local_b8.ptr = L"-- %%INSERT_APP_ARGUMENTS%% --";
  local_d8.size = 0;
  local_b8.size = 0x1e;
  pQVar9 = QHash<QString,_QString>::operator[](&local_c0,(QString *)&local_b8);
  QString::operator=(pQVar9,(QString *)&options->applicationArguments);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
  local_b8.d = (Data *)0x0;
  local_d8.d = (Data *)0x0;
  local_d8.ptr = (char16_t *)0x0;
  local_d8.size = 0;
  local_b8.ptr = L"-- %%INSERT_APP_LIB_NAME%% --";
  local_b8.size = 0x1d;
  pQVar9 = QHash<QString,_QString>::operator[](&local_c0,(QString *)&local_b8);
  QString::operator=(pQVar9,(QString *)&options->applicationBinary);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
  local_b8.d = (Data *)0x0;
  local_d8.d = (Data *)0x0;
  local_d8.ptr = (char16_t *)0x0;
  local_b8.ptr = L"-- %%INSERT_VERSION_NAME%% --";
  local_d8.size = 0;
  local_b8.size = 0x1d;
  pQVar9 = QHash<QString,_QString>::operator[](&local_c0,(QString *)&local_b8);
  QString::operator=(pQVar9,(QString *)&options->versionName);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
  local_b8.d = (Data *)0x0;
  local_d8.d = (Data *)0x0;
  local_d8.ptr = (char16_t *)0x0;
  local_b8.ptr = L"-- %%INSERT_VERSION_CODE%% --";
  local_d8.size = 0;
  local_b8.size = 0x1d;
  pQVar9 = QHash<QString,_QString>::operator[](&local_c0,(QString *)&local_b8);
  QString::operator=(pQVar9,(QString *)&options->versionCode);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
  local_b8.ptr = (options->packageName).d.ptr;
  local_b8.size = (options->packageName).d.size | 0x8000000000000000;
  local_b8.d = (Data *)CONCAT71(local_b8.d._1_7_,1);
  local_58.ptr = (char16_t *)0x0;
  QVar15.m_size = (size_t)"package=\"%1\"";
  QVar15.field_0.m_data = &local_d8;
  local_58.d = (Data *)&local_b8;
  QtPrivate::argToQString(QVar15,0x400000000000000c,(ArgBase **)0x1);
  local_b8.d = (Data *)0x0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_b8.ptr = L"package=\"org.qtproject.example\"";
  local_58.size = 0;
  local_b8.size = 0x1f;
  pQVar9 = QHash<QString,_QString>::operator[](&local_c0,(QString *)&local_b8);
  pDVar3 = (pQVar9->d).d;
  pcVar14 = (pQVar9->d).ptr;
  (pQVar9->d).d = local_d8.d;
  (pQVar9->d).ptr = local_d8.ptr;
  qVar1 = (pQVar9->d).size;
  (pQVar9->d).size = local_d8.size;
  local_d8.d = pDVar3;
  local_d8.ptr = pcVar14;
  local_d8.size = qVar1;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
  local_d8.size = -0x5555555555555556;
  local_d8.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_d8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  latin1.m_data = "android:icon=\"%1\"";
  latin1.m_size = 0x11;
  QString::QString((QString *)&local_d8,latin1);
  if ((options->appIcon).d.size == 0) {
    QString::QString((QString *)&local_b8,(QLatin1StringView)(ZEXT816(0x13a378) << 0x40));
  }
  else {
    QString::arg<QString,_true>
              ((QString *)&local_b8,(QString *)&local_d8,&options->appIcon,0,(QChar)0x20);
  }
  local_108.d = (Data *)0x19;
  local_108.ptr = L"-- %%INSERT_APP_ICON%% --";
  QString::arg<QLatin1String,_true>
            ((QString *)&local_58,(QString *)&local_d8,(QLatin1String *)&local_108,0,(QChar)0x20);
  pQVar9 = QHash<QString,_QString>::operator[](&local_c0,(QString *)&local_58);
  pDVar3 = (pQVar9->d).d;
  pcVar14 = (pQVar9->d).ptr;
  (pQVar9->d).d = local_b8.d;
  (pQVar9->d).ptr = local_b8.ptr;
  qVar1 = (pQVar9->d).size;
  (pQVar9->d).size = local_b8.size;
  local_b8.d = pDVar3;
  local_b8.ptr = pcVar14;
  local_b8.size = qVar1;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
  local_58.size = -0x5555555555555556;
  local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_b8.d = (Data *)&options->outputDirectory;
  local_b8.ptr = (char16_t *)0x14;
  local_b8.size = 0x13782c;
  QStringBuilder<QString_&,_QLatin1String>::convertTo<QString>
            ((QString *)&local_58,(QStringBuilder<QString_&,_QLatin1String> *)&local_b8);
  local_e8 = 0xaaaaaaaaaaaaaaaa;
  uStack_e0 = 0xaaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_e8,(QString *)&local_58);
  cVar5 = QFile::exists();
  if (cVar5 != '\0') {
    cVar5 = QFile::open(&local_e8,1);
    if (cVar5 != '\0') {
      _reader = (Data *)0xaaaaaaaaaaaaaaaa;
      QXmlStreamReader::QXmlStreamReader(&reader,(QIODevice *)&local_e8);
      while( true ) {
        cVar5 = QXmlStreamReader::atEnd();
        if (cVar5 != '\0') break;
        QXmlStreamReader::readNext();
        bVar6 = QXmlStreamReader::isStartElement(&reader);
        if (bVar6) {
          auVar25 = QXmlStreamReader::name();
          local_108.d = (Data *)0xf;
          local_108.ptr = L"uses-permission";
          local_b8._0_16_ = auVar25;
          bVar6 = comparesEqual((QLatin1StringView *)&local_108,(QStringView *)&local_b8);
          if (bVar6) {
            QXmlStreamReader::attributes();
            QVar16.m_size = (size_t)"android:name";
            QVar16.field_0.m_data = &local_108;
            auVar25 = QXmlStreamAttributes::value(QVar16);
            QString::QString((QString *)&local_b8,auVar25._8_8_,auVar25._0_8_);
            QMap<QString,_QString>::remove(&options->modulePermissions,(char *)&local_b8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
            QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer
                      ((QArrayDataPointer<QXmlStreamAttribute> *)&local_108);
            QXmlStreamReader::attributes();
            QVar17.m_size = (size_t)"android:name";
            QVar17.field_0.m_data = &local_108;
            auVar25 = QXmlStreamAttributes::value(QVar17);
            QString::QString((QString *)&local_b8,auVar25._8_8_,auVar25._0_8_);
            QMap<QString,_QString>::remove(&options->applicationPermissions,(char *)&local_b8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
            QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer
                      ((QArrayDataPointer<QXmlStreamAttribute> *)&local_108);
          }
        }
      }
      QFileDevice::close();
      QXmlStreamReader::~QXmlStreamReader(&reader);
    }
  }
  local_110.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_>
        )(options->modulePermissions).d.d.ptr;
  if (local_110.d.d.ptr !=
      (totally_ordered_wrapper<QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_*>
       )0x0) {
    LOCK();
    *(int *)local_110.d.d.ptr = *(int *)local_110.d.d.ptr + 1;
    UNLOCK();
  }
  iVar10._M_node = (_Base_ptr)QMap<QString,_QString>::begin(&options->applicationPermissions);
  iVar11 = QMap<QString,_QString>::end(&options->applicationPermissions);
  while ((iterator)iVar10._M_node != iVar11.i._M_node) {
    QMap<QString,_QString>::insert
              (&local_110,(QString *)(iVar10._M_node + 1),(QString *)&iVar10._M_node[1]._M_right);
    iVar10._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar10._M_node);
  }
  local_108.d = (Data *)0x0;
  local_108.ptr = (char16_t *)0x0;
  local_108.size = 0;
  iVar10._M_node = (_Base_ptr)QMap<QString,_QString>::begin(&local_110);
  iVar11 = QMap<QString,_QString>::end(&local_110);
  auVar25 = (undefined1  [16])local_b8._0_16_;
  while ((iterator)iVar10._M_node != iVar11.i._M_node) {
    local_b8.ptr = (char16_t *)iVar10._M_node[1]._M_parent;
    local_b8.size = (ulong)iVar10._M_node[1]._M_left | 0x8000000000000000;
    local_b8.d._1_7_ = auVar25._1_7_;
    local_b8.d = (Data *)CONCAT71(local_b8.d._1_7_,1);
    local_78.ptr = (char16_t *)0x0;
    QVar18.m_size = (size_t)"    <uses-permission android:name=\"%1\" %2 />\n";
    QVar18.field_0.m_data = &reader;
    local_78.d = (Data *)&local_b8;
    QtPrivate::argToQString(QVar18,0x400000000000002d,(ArgBase **)0x1);
    QString::arg<QString,_true>
              ((QString *)&local_b8,(QString *)&reader,(QString *)&iVar10._M_node[1]._M_right,0,
               (QChar)0x20);
    QString::append((QString *)&local_108);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&reader);
    iVar10._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar10._M_node);
    auVar25._8_8_ = local_b8.ptr;
    auVar25._0_8_ = local_b8.d;
  }
  local_b8._0_16_ = auVar25;
  QString::trimmed_helper((QString *)&local_b8);
  _reader = (Data *)0x0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (char16_t *)0x0;
  local_78.size = 0;
  pQVar9 = QHash<QString,_QString>::operator[](&local_c0,(QString *)&reader);
  pDVar3 = (pQVar9->d).d;
  pcVar14 = (pQVar9->d).ptr;
  (pQVar9->d).d = local_b8.d;
  (pQVar9->d).ptr = local_b8.ptr;
  uVar2 = (pQVar9->d).size;
  (pQVar9->d).size = local_b8.size;
  local_b8.d = pDVar3;
  local_b8.ptr = pcVar14;
  local_b8.size = uVar2;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&reader);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
  _reader = (Data *)0x0;
  pQVar9 = (options->features).d.ptr;
  for (lVar13 = (options->features).d.size * 0x18; lVar13 != 0; lVar13 = lVar13 + -0x18) {
    local_b8.ptr = (pQVar9->d).ptr;
    local_b8.size = (pQVar9->d).size | 0x8000000000000000;
    local_b8.d = (Data *)CONCAT71(local_b8.d._1_7_,1);
    local_98 = (undefined1  [8])&local_b8;
    pcStack_90 = (char16_t *)0x0;
    QVar19.m_size = (size_t)"    <uses-feature android:name=\"%1\" android:required=\"false\" />\n";
    QVar19.field_0.m_data = &local_78;
    QtPrivate::argToQString(QVar19,0x4000000000000040,(ArgBase **)0x1);
    QString::append((QString *)&reader);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    pQVar9 = pQVar9 + 1;
  }
  if (options->usesOpenGL != false) {
    QVar20.m_data = (char *)0x4d;
    QVar20.m_size = (qsizetype)&reader;
    QString::append(QVar20);
  }
  QString::trimmed_helper((QString *)&local_b8);
  local_78.d = (Data *)0x0;
  local_98 = (undefined1  [8])0x0;
  pcStack_90 = (char16_t *)0x0;
  local_78.ptr = L"<!-- %%INSERT_FEATURES -->";
  local_88 = 0;
  local_78.size = 0x1a;
  pQVar9 = QHash<QString,_QString>::operator[](&local_c0,(QString *)&local_78);
  pDVar3 = (pQVar9->d).d;
  pcVar14 = (pQVar9->d).ptr;
  (pQVar9->d).d = local_b8.d;
  (pQVar9->d).ptr = local_b8.ptr;
  qVar1 = (pQVar9->d).size;
  (pQVar9->d).size = local_b8.size;
  local_b8.d = pDVar3;
  local_b8.ptr = pcVar14;
  local_b8.size = qVar1;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
  bVar6 = updateFile((QString *)&local_58,&local_c0);
  if (bVar6) {
    cVar5 = QFile::exists();
    if (cVar5 == '\0') {
      fwrite("No android manifest file",0x18,1,_stderr);
    }
    else {
      cVar5 = QFile::open(&local_e8,1);
      pFVar4 = _stderr;
      if (cVar5 == '\0') {
        QString::toLocal8Bit((QByteArray *)&local_b8,(QString *)&local_58);
        pcVar14 = local_b8.ptr;
        if (local_b8.ptr == (char16_t *)0x0) {
          pcVar14 = (char16_t *)&QByteArray::_empty;
        }
        bVar6 = false;
        fprintf(pFVar4,"Cannot open %s for reading.\n",pcVar14);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_b8);
        goto LAB_00114af8;
      }
      _reader_1 = 0xaaaaaaaaaaaaaaaa;
      QXmlStreamReader::QXmlStreamReader(&reader_1,(QIODevice *)&local_e8);
      bVar7 = false;
LAB_0011466a:
      do {
        do {
          do {
            while( true ) {
              do {
                cVar5 = QXmlStreamReader::atEnd();
                if (cVar5 != '\0') {
                  bVar6 = QXmlStreamReader::hasError(&reader_1);
                  pFVar4 = _stderr;
                  if (!bVar6) {
                    QXmlStreamReader::~QXmlStreamReader(&reader_1);
                    bVar6 = true;
                    if (bVar7) {
                      updateStringsXml(options);
                    }
                    goto LAB_00114af8;
                  }
                  QString::toLocal8Bit((QByteArray *)&local_b8,(QString *)&local_58);
                  pcVar14 = local_b8.ptr;
                  if (local_b8.ptr == (char16_t *)0x0) {
                    pcVar14 = (char16_t *)&QByteArray::_empty;
                  }
                  QXmlStreamReader::errorString();
                  QString::toLocal8Bit((QByteArray *)&local_78,(QString *)local_98);
                  pcVar12 = local_78.ptr;
                  if (local_78.ptr == (char16_t *)0x0) {
                    pcVar12 = (char16_t *)&QByteArray::_empty;
                  }
                  fprintf(pFVar4,"Error in %s: %s\n",pcVar14,pcVar12);
                  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_78);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)local_98);
                  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_b8);
                  goto LAB_00114aec;
                }
                QXmlStreamReader::readNext();
                bVar6 = QXmlStreamReader::isStartElement(&reader_1);
              } while (!bVar6);
              auVar25 = QXmlStreamReader::name();
              local_78.d = (Data *)0x8;
              local_78.ptr = L"uses-sdk";
              local_b8._0_16_ = auVar25;
              bVar6 = comparesEqual((QLatin1StringView *)&local_78,(QStringView *)&local_b8);
              if (!bVar6) break;
              QXmlStreamReader::attributes();
              qualifiedName.m_size = 0x4000000000000015;
              qualifiedName.field_0.m_data_utf8 = "android:minSdkVersion";
              bVar6 = QXmlStreamAttributes::hasAttribute
                                ((QXmlStreamAttributes *)&local_b8,qualifiedName);
              QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer
                        ((QArrayDataPointer<QXmlStreamAttribute> *)&local_b8);
              if (bVar6) {
                QXmlStreamReader::attributes();
                QVar21.m_size = (size_t)"android:minSdkVersion";
                QVar21.field_0.m_data_utf8 = (char *)&local_b8;
                local_78._0_16_ = QXmlStreamAttributes::value(QVar21);
                iVar8 = QStringView::toInt((QStringView *)&local_78,(bool *)0x0,10);
                QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer
                          ((QArrayDataPointer<QXmlStreamAttribute> *)&local_b8);
                if (iVar8 < 0x1c) {
                  __ptr = "Invalid minSdkVersion version, minSdkVersion must be >= 28\n";
                  sStack_1b0 = 0x3b;
                  goto LAB_00114b8d;
                }
              }
            }
            QVar26 = (QStringView)QXmlStreamReader::name();
            local_140.m_size = 0xb;
            local_140.m_data = "application";
            _local_98 = QVar26;
            bVar6 = comparesEqual(&local_140,(QStringView *)local_98);
            if (bVar6) {
LAB_001147df:
              QXmlStreamReader::attributes();
              qualifiedName_00.m_size = 0x400000000000000d;
              qualifiedName_00.field_0.m_data_utf8 = "android:label";
              bVar6 = QXmlStreamAttributes::hasAttribute
                                ((QXmlStreamAttributes *)&local_b8,qualifiedName_00);
              if (bVar6) {
                QXmlStreamReader::attributes();
                QVar22.m_size = (size_t)"android:label";
                QVar22.field_0.m_data = &local_78;
                QVar26 = (QStringView)QXmlStreamAttributes::value(QVar22);
                local_180.m_size = 0x10;
                local_180.m_data = "@string/app_name";
                local_170 = QVar26;
                bVar6 = comparesEqual(&local_180,&local_170);
                QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer
                          ((QArrayDataPointer<QXmlStreamAttribute> *)&local_78);
                QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer
                          ((QArrayDataPointer<QXmlStreamAttribute> *)&local_b8);
                if (bVar6) {
                  bVar7 = true;
                  goto LAB_0011466a;
                }
              }
              else {
                QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer
                          ((QArrayDataPointer<QXmlStreamAttribute> *)&local_b8);
              }
            }
            else {
              QVar26 = (QStringView)QXmlStreamReader::name();
              local_160.m_size = 8;
              local_160.m_data = "activity";
              local_150 = QVar26;
              bVar6 = comparesEqual(&local_160,&local_150);
              if (bVar6) goto LAB_001147df;
            }
            auVar25 = QXmlStreamReader::name();
            local_78.d = (Data *)0x9;
            local_78.ptr = L"meta-data";
            local_b8._0_16_ = auVar25;
            bVar6 = comparesEqual((QLatin1StringView *)&local_78,(QStringView *)&local_b8);
          } while (!bVar6);
          local_78.d = (Data *)0xaaaaaaaaaaaaaaaa;
          local_78.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
          QXmlStreamReader::attributes();
          QVar23.m_size = (size_t)"android:name";
          QVar23.field_0.m_data_utf8 = (char *)&local_b8;
          local_78._0_16_ = QXmlStreamAttributes::value(QVar23);
          QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer
                    ((QArrayDataPointer<QXmlStreamAttribute> *)&local_b8);
          local_98 = (undefined1  [8])0xaaaaaaaaaaaaaaaa;
          pcStack_90 = (char16_t *)0xaaaaaaaaaaaaaaaa;
          QXmlStreamReader::attributes();
          QVar24.m_size = (size_t)"android:value";
          QVar24.field_0.m_data_utf8 = (char *)&local_b8;
          _local_98 = (QStringView)QXmlStreamAttributes::value(QVar24);
          QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer
                    ((QArrayDataPointer<QXmlStreamAttribute> *)&local_b8);
          local_b8.d = (Data *)0x14;
          local_b8.ptr = L"android.app.lib_name";
          bVar6 = comparesEqual((QLatin1StringView *)&local_b8,(QStringView *)&local_78);
        } while (!bVar6);
        bVar6 = QStringView::contains((QStringView *)local_98,(QChar)0x20,CaseSensitive);
      } while (!bVar6);
      __ptr = "The Activity\'s android.app.lib_name should not contain spaces.\n";
      sStack_1b0 = 0x3f;
LAB_00114b8d:
      fwrite(__ptr,sStack_1b0,1,_stderr);
LAB_00114aec:
      QXmlStreamReader::~QXmlStreamReader(&reader_1);
    }
  }
  bVar6 = false;
LAB_00114af8:
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&reader);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_110.d);
  QFile::~QFile((QFile *)&local_e8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
  QHash<QString,_QString>::~QHash(&local_c0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool updateAndroidManifest(Options &options)
{
    if (options.verbose)
        fprintf(stdout, "  -- AndroidManifest.xml \n");

    QHash<QString, QString> replacements;
    replacements[QStringLiteral("-- %%INSERT_APP_NAME%% --")] = options.appName;
    replacements[QStringLiteral("-- %%INSERT_APP_ARGUMENTS%% --")] = options.applicationArguments;
    replacements[QStringLiteral("-- %%INSERT_APP_LIB_NAME%% --")] = options.applicationBinary;
    replacements[QStringLiteral("-- %%INSERT_VERSION_NAME%% --")] = options.versionName;
    replacements[QStringLiteral("-- %%INSERT_VERSION_CODE%% --")] = options.versionCode;
    replacements[QStringLiteral("package=\"org.qtproject.example\"")] = "package=\"%1\""_L1.arg(options.packageName);

    const QString iconAttribute = "android:icon=\"%1\""_L1;
    replacements[iconAttribute.arg("-- %%INSERT_APP_ICON%% --"_L1)] = options.appIcon.isEmpty() ?
            ""_L1 : iconAttribute.arg(options.appIcon);

    const QString androidManifestPath = options.outputDirectory + "/AndroidManifest.xml"_L1;
    QFile androidManifestXml(androidManifestPath);
    // User may have manually defined permissions in the AndroidManifest.xml
    // Read these permissions in order to remove any duplicates, as otherwise the
    // application build would fail.
    if (androidManifestXml.exists() && androidManifestXml.open(QIODevice::ReadOnly)) {
        QXmlStreamReader reader(&androidManifestXml);
        while (!reader.atEnd()) {
            reader.readNext();
            if (reader.isStartElement() && reader.name() == "uses-permission"_L1) {
                options.modulePermissions.remove(
                        QString(reader.attributes().value("android:name"_L1)));
                options.applicationPermissions.remove(
                        QString(reader.attributes().value("android:name"_L1)));
            }
        }
        androidManifestXml.close();
    }

    // Application may define permissions in its CMakeLists.txt, give them the priority
    QMap<QString, QString> resolvedPermissions = options.modulePermissions;
    for (auto [name, extras] : options.applicationPermissions.asKeyValueRange())
        resolvedPermissions.insert(name, extras);

    QString permissions;
    for (auto [name, extras] : resolvedPermissions.asKeyValueRange())
        permissions += "    <uses-permission android:name=\"%1\" %2 />\n"_L1.arg(name).arg(extras);
    replacements[QStringLiteral("<!-- %%INSERT_PERMISSIONS -->")] = permissions.trimmed();

    QString features;
    for (const QString &feature : std::as_const(options.features))
        features += "    <uses-feature android:name=\"%1\" android:required=\"false\" />\n"_L1.arg(feature);
    if (options.usesOpenGL)
        features += "    <uses-feature android:glEsVersion=\"0x00020000\" android:required=\"true\" />"_L1;

    replacements[QStringLiteral("<!-- %%INSERT_FEATURES -->")] = features.trimmed();

    if (!updateFile(androidManifestPath, replacements))
        return false;

    // read the package, min & target sdk API levels from manifest file.
    bool checkOldAndroidLabelString = false;
    if (androidManifestXml.exists()) {
        if (!androidManifestXml.open(QIODevice::ReadOnly)) {
            fprintf(stderr, "Cannot open %s for reading.\n", qPrintable(androidManifestPath));
            return false;
        }

        QXmlStreamReader reader(&androidManifestXml);
        while (!reader.atEnd()) {
            reader.readNext();

            if (reader.isStartElement()) {
                if (reader.name() == "uses-sdk"_L1) {
                    if (reader.attributes().hasAttribute("android:minSdkVersion"_L1))
                        if (reader.attributes().value("android:minSdkVersion"_L1).toInt() < 28) {
                            fprintf(stderr, "Invalid minSdkVersion version, minSdkVersion must be >= 28\n");
                            return false;
                        }
                } else if ((reader.name() == "application"_L1 ||
                            reader.name() == "activity"_L1) &&
                           reader.attributes().hasAttribute("android:label"_L1) &&
                           reader.attributes().value("android:label"_L1) == "@string/app_name"_L1) {
                    checkOldAndroidLabelString = true;
                } else if (reader.name() == "meta-data"_L1) {
                    const auto name = reader.attributes().value("android:name"_L1);
                    const auto value = reader.attributes().value("android:value"_L1);
                    if (name == "android.app.lib_name"_L1 && value.contains(u' ')) {
                        fprintf(stderr, "The Activity's android.app.lib_name should not contain"
                                        " spaces.\n");
                        return false;
                    }
                }
            }
        }

        if (reader.hasError()) {
            fprintf(stderr, "Error in %s: %s\n", qPrintable(androidManifestPath), qPrintable(reader.errorString()));
            return false;
        }
    } else {
        fprintf(stderr, "No android manifest file");
        return false;
    }

    if (checkOldAndroidLabelString)
        updateStringsXml(options);

    return true;
}